

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_label(LexState *ls)

{
  MSize MVar1;
  int iVar2;
  GCstr *name_00;
  VarInfo *pVVar3;
  LexState *in_RDI;
  LexState *unaff_retaddr;
  MSize idx;
  GCstr *name;
  FuncState *fs;
  LexToken in_stack_ffffffffffffffdc;
  BCPos in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint8_t info;
  FuncState *ls_00;
  
  ls_00 = in_RDI->fs;
  ls_00->lasttarget = ls_00->pc;
  *(byte *)(((TValue *)&ls_00->bl)->u64 + 0xd) = *(byte *)(((TValue *)&ls_00->bl)->u64 + 0xd) | 4;
  lj_lex_next((LexState *)0x149d63);
  name_00 = lex_str((LexState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  info = (uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  pVVar3 = gola_findlabel(in_RDI,name_00);
  if (pVVar3 != (VarInfo *)0x0) {
    lj_lex_error(in_RDI,0,LJ_ERR_XLDUP,name_00 + 1);
  }
  MVar1 = gola_new((LexState *)ls_00,name_00,info,in_stack_ffffffffffffffe0);
  lex_check((LexState *)CONCAT44(MVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  while (in_RDI->tok == 0x11d) {
    synlevel_begin((LexState *)0x149dea);
    parse_label((LexState *)ls_00);
    in_RDI->level = in_RDI->level - 1;
  }
  iVar2 = parse_isend(in_RDI->tok);
  if ((iVar2 != 0) && (in_RDI->tok != 0x115)) {
    in_RDI->vstack[MVar1].slot = *(uint8_t *)(((TValue *)&ls_00->bl)->u64 + 0xc);
  }
  gola_resolve(unaff_retaddr,(FuncScope *)in_RDI,(MSize)((ulong)ls_00 >> 0x20));
  return;
}

Assistant:

static void parse_label(LexState *ls)
{
  FuncState *fs = ls->fs;
  GCstr *name;
  MSize idx;
  fs->lasttarget = fs->pc;
  fs->bl->flags |= FSCOPE_GOLA;
  lj_lex_next(ls);  /* Skip '::'. */
  name = lex_str(ls);
  if (gola_findlabel(ls, name))
    lj_lex_error(ls, 0, LJ_ERR_XLDUP, strdata(name));
  idx = gola_new(ls, name, VSTACK_LABEL, fs->pc);
  lex_check(ls, TK_label);
  /* Recursively parse trailing statements: labels and ';' (Lua 5.2 only). */
  for (;;) {
    if (ls->tok == TK_label) {
      synlevel_begin(ls);
      parse_label(ls);
      synlevel_end(ls);
    } else if (LJ_52 && ls->tok == ';') {
      lj_lex_next(ls);
    } else {
      break;
    }
  }
  /* Trailing label is considered to be outside of scope. */
  if (parse_isend(ls->tok) && ls->tok != TK_until)
    ls->vstack[idx].slot = fs->bl->nactvar;
  gola_resolve(ls, fs->bl, idx);
}